

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBasePrimitiveTest_GetRepeatedField_Test::
~MapFieldBasePrimitiveTest_GetRepeatedField_Test
          (MapFieldBasePrimitiveTest_GetRepeatedField_Test *this)

{
  MapFieldBasePrimitiveTest_GetRepeatedField_Test *this_local;
  
  ~MapFieldBasePrimitiveTest_GetRepeatedField_Test(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

TEST_P(MapFieldBasePrimitiveTest, GetRepeatedField) {
  const RepeatedPtrField<Message>& repeated =
      reinterpret_cast<const RepeatedPtrField<Message>&>(
          map_field_base_->GetRepeatedField());
  EXPECT_EQ(2, repeated.size());
  for (int i = 0; i < repeated.size(); i++) {
    const Message& message = repeated.Get(i);
    int key = message.GetReflection()->GetInt32(message, key_descriptor_);
    int value = message.GetReflection()->GetInt32(message, value_descriptor_);
    EXPECT_EQ(value, initial_value_map_[key]);
  }
}